

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

void cnn::GraphOptimize(ComputationGraph *cg)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppNVar4;
  reference pVVar5;
  uint *puVar6;
  reference pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ostream *poVar8;
  ostream *poVar9;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *in_RDI;
  VariableIndex e_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *__range2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  uint i_1;
  int pte;
  int weight;
  VariableIndex e;
  iterator __end2;
  iterator __begin2;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *__range2;
  value_type *lp;
  Node *v;
  uint i;
  vector<int,_std::allocator<int>_> longest_paths;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *nodes;
  value_type *in_stack_fffffffffffffe58;
  ostream *in_stack_fffffffffffffe60;
  allocator_type *in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffe78;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe80;
  ostream *in_stack_fffffffffffffe88;
  allocator *__lhs;
  string local_138 [32];
  string local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  string local_d0 [36];
  VariableIndex local_ac;
  VariableIndex *local_a8;
  __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
  local_a0;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *local_98;
  undefined1 local_90 [24];
  uint local_78;
  int local_74;
  int local_70;
  VariableIndex local_6c;
  VariableIndex *local_68;
  __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
  local_60;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *local_58;
  int *local_50;
  value_type local_48;
  uint local_40;
  vector<int,_std::allocator<int>_> local_28;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *local_10;
  
  local_10 = in_RDI;
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size(in_RDI);
  std::allocator<int>::allocator((allocator<int> *)0x5e6633);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::allocator<int>::~allocator((allocator<int> *)0x5e6659);
  local_40 = 0;
  while( true ) {
    uVar2 = (ulong)local_40;
    sVar3 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size(local_10);
    if (sVar3 <= uVar2) break;
    ppNVar4 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::operator[]
                        (local_10,(ulong)local_40);
    local_48 = *ppNVar4;
    local_50 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(ulong)local_40);
    local_58 = &local_48->args;
    local_60._M_current =
         (VariableIndex *)
         std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::begin
                   ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                    in_stack_fffffffffffffe58);
    local_68 = (VariableIndex *)
               std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::end
                         ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                          in_stack_fffffffffffffe58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                          *)in_stack_fffffffffffffe60,
                         (__normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                          *)in_stack_fffffffffffffe58);
      if (!bVar1) break;
      pVVar5 = __gnu_cxx::
               __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
               ::operator*(&local_60);
      VariableIndex::VariableIndex(&local_6c,pVVar5);
      local_70 = 0;
      sVar3 = std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::size
                        (&local_48->args);
      if (sVar3 == 7) {
        local_70 = 1;
      }
      puVar6 = VariableIndex::operator_cast_to_unsigned_int_(&local_6c);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(ulong)*puVar6);
      local_74 = *pvVar7 + local_70;
      if (*local_50 < local_74) {
        *local_50 = local_74;
      }
      __gnu_cxx::
      __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
      ::operator++(&local_60);
    }
    local_40 = local_40 + 1;
  }
  local_78 = 0;
  while( true ) {
    uVar2 = (ulong)local_78;
    sVar3 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size(local_10);
    if (sVar3 <= uVar2) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x5e6882);
    ppNVar4 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::operator[]
                        (local_10,(ulong)local_78);
    local_98 = &(*ppNVar4)->args;
    local_a0._M_current =
         (VariableIndex *)
         std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::begin
                   ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                    in_stack_fffffffffffffe58);
    local_a8 = (VariableIndex *)
               std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::end
                         ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                          in_stack_fffffffffffffe58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                          *)in_stack_fffffffffffffe60,
                         (__normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                          *)in_stack_fffffffffffffe58);
      if (!bVar1) break;
      pVVar5 = __gnu_cxx::
               __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
               ::operator*(&local_a0);
      VariableIndex::VariableIndex(&local_ac,pVVar5);
      __lhs = &local_f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"x",__lhs);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              VariableIndex::operator_cast_to_unsigned_int_(&local_ac);
      std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     __rhs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      __gnu_cxx::
      __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
      ::operator++(&local_a0);
    }
    in_stack_fffffffffffffe88 = std::operator<<((ostream *)&std::cerr,"LONGEST PATH: ");
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(ulong)local_78);
    poVar8 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe88,*pvVar7);
    poVar8 = std::operator<<(poVar8,"\tx");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_78);
    poVar9 = std::operator<<(poVar8," = ");
    ppNVar4 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::operator[]
                        (local_10,(ulong)local_78);
    (*(*ppNVar4)->_vptr_Node[3])(local_138,*ppNVar4,local_90);
    in_stack_fffffffffffffe60 = std::operator<<(poVar9,local_138);
    std::ostream::operator<<(in_stack_fffffffffffffe60,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)poVar8);
    local_78 = local_78 + 1;
  }
  abort();
}

Assistant:

void GraphOptimize(ComputationGraph* cg) {
  // topo sort
  vector<Node*>& nodes = cg->nodes;
  vector<int> longest_paths(nodes.size());
  for (unsigned i = 0; i < nodes.size(); ++i) {
    auto& v = *nodes[i];  // vertex v_i
    auto& lp = longest_paths[i]; // distance to v_i
    for (auto e : v.args) {
      int weight = 0;
      if (v.args.size() == 7) weight = 1;
      int pte = longest_paths[e] + weight;
      if (pte > lp) lp = pte;
    }
  }
  for (unsigned i = 0; i < nodes.size(); ++i) {
    vector<string> x;
    for (auto e : nodes[i]->args) {
      x.push_back(string("x") + to_string(e));
    }
    cerr << "LONGEST PATH: " << longest_paths[i] << "\tx" << i << " = " << nodes[i]->as_string(x) << endl;
  }
  abort();// DEBUGGING
}